

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall
CryptoUtil_DecryptAes256CbcToStringDataSizeError_Test::
~CryptoUtil_DecryptAes256CbcToStringDataSizeError_Test
          (CryptoUtil_DecryptAes256CbcToStringDataSizeError_Test *this)

{
  CryptoUtil_DecryptAes256CbcToStringDataSizeError_Test *this_local;
  
  ~CryptoUtil_DecryptAes256CbcToStringDataSizeError_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CryptoUtil, DecryptAes256CbcToStringDataSizeError) {
  try {
    ByteData key(
        "616975656F616975656F616975656F616975656F616975656F616975656F6169");
    ByteData iv("33343536373839303132333435363738");
    ByteData data(
        "2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d");
    std::string result = CryptoUtil::DecryptAes256CbcToString(key.GetBytes(),
                                                              iv.GetBytes(),
                                                              data);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "DecryptAes256Cbc error.");
    return;
  }
  ASSERT_TRUE(false);
}